

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_resize.c
# Opt level: O3

int cvBuildNordsieckArrayBDF
              (sunrealtype *t,N_Vector *y,N_Vector f,N_Vector *wrk,int order,sunrealtype hscale,
              N_Vector *zn)

{
  N_Vector *pp_Var1;
  double dVar2;
  N_Vector p_Var3;
  bool bVar4;
  undefined4 in_EAX;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  N_Vector *pp_Var9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  double dVar14;
  undefined1 auVar15 [16];
  sunrealtype t_ext [6];
  int local_a8;
  sunrealtype local_70;
  double local_68;
  undefined1 local_60 [48];
  
  auVar15._0_4_ = -(uint)(t == (sunrealtype *)0x0);
  auVar15._4_4_ = -(uint)(y == (N_Vector *)0x0);
  auVar15._8_4_ = -(uint)(f == (N_Vector)0x0);
  auVar15._12_4_ = -(uint)(wrk == (N_Vector *)0x0);
  iVar5 = movmskps(in_EAX,auVar15);
  iVar6 = -0x16;
  if ((zn != (N_Vector *)0x0 && 0 < order) && iVar5 == 0) {
    uVar8 = (ulong)(uint)order;
    uVar7 = 0;
    do {
      if (y[uVar7] == (N_Vector)0x0) {
        return -0x16;
      }
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    uVar11 = (ulong)(order + 1);
    uVar7 = 0;
    do {
      if (wrk[uVar7] == (N_Vector)0x0) {
        return -0x16;
      }
      uVar7 = uVar7 + 1;
    } while (uVar11 != uVar7);
    local_70 = hscale;
    if (1 < order) {
      dVar2 = *t;
      local_68 = dVar2;
      memcpy(local_60,t,uVar8 * 8);
      N_VScale(0x3ff0000000000000,*y,*wrk);
      lVar12 = 0;
      do {
        N_VScale(0x3ff0000000000000,y[lVar12],wrk[lVar12 + 1]);
        lVar12 = lVar12 + 1;
      } while (uVar11 - 1 != lVar12);
      uVar7 = 1;
      pdVar13 = &local_68;
      lVar12 = uVar8 + 1;
      do {
        do {
          if (lVar12 == 2 && uVar7 == 1) {
            N_VScale(f,wrk[1]);
          }
          else {
            dVar14 = 1.0 / (pdVar13[lVar12 + -2] - (&local_70)[lVar12]);
            N_VLinearSum(dVar14,-dVar14,wrk[lVar12 + -2],wrk[lVar12 + -1]);
          }
          lVar12 = lVar12 + -1;
        } while ((long)uVar7 < lVar12);
        uVar7 = uVar7 + 1;
        pdVar13 = pdVar13 + -1;
        lVar12 = uVar8 + 1;
      } while (uVar7 != uVar11);
      N_VScale(0x3ff0000000000000,wrk[uVar8],*zn);
      uVar7 = 1;
      do {
        N_VConst(0,zn[uVar7]);
        uVar7 = uVar7 + 1;
      } while (uVar11 != uVar7);
      uVar7 = uVar8;
      do {
        uVar10 = uVar7 - 1 & 0xffffffff;
        dVar14 = dVar2 - *(double *)(local_60 + uVar10 * 8 + -8);
        pp_Var9 = zn + uVar8;
        iVar5 = order;
        do {
          pp_Var1 = pp_Var9 + -1;
          p_Var3 = *pp_Var9;
          pp_Var9 = pp_Var9 + -1;
          N_VLinearSum(dVar14,(double)iVar5,p_Var3,*pp_Var1,p_Var3);
          bVar4 = 1 < iVar5;
          iVar5 = iVar5 + -1;
        } while (bVar4);
        N_VLinearSum(dVar14,0x3ff0000000000000,*zn,wrk[uVar10],*zn);
        local_a8 = (int)uVar7;
        uVar7 = uVar7 - 1;
      } while (1 < local_a8);
    }
    N_VScale(0x3ff0000000000000,*y,*zn);
    N_VScale(0x3ff0000000000000,f,zn[1]);
    uVar7 = 1;
    do {
      N_VScale(zn[uVar7],zn[uVar7]);
      uVar7 = uVar7 + 1;
    } while (uVar11 != uVar7);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int cvBuildNordsieckArrayBDF(sunrealtype* t, N_Vector* y, N_Vector f,
                                    N_Vector* wrk, int order,
                                    sunrealtype hscale, N_Vector* zn)
{
  /* Check for valid inputs */
  if (!t || !y || !f || !wrk || order < 1 || !zn) { return CV_ILL_INPUT; }

  for (int i = 0; i < order; i++)
  {
    if (!y[i]) { return CV_ILL_INPUT; }
  }

  for (int i = 0; i < order + 1; i++)
  {
    if (!wrk[i]) { return CV_ILL_INPUT; }
  }

  /* Compute Nordsieck array */
  if (order > 1)
  {
    /* Setup extended array of times to incorporate derivative value */
    sunrealtype t_ext[BDF_Q_MAX + 1];

    t_ext[0] = t[0];
    for (int i = 1; i <= order; i++) { t_ext[i] = t[i - 1]; }

    /* Compute Hermite polynomial coefficients interpolating y history and f */
    N_VScale(ONE, y[0], wrk[0]);
    for (int i = 1; i <= order; i++) { N_VScale(ONE, y[i - 1], wrk[i]); }

    for (int i = 1; i <= order; i++)
    {
      for (int j = order; j > i - 1; j--)
      {
        if (i == 1 && j == 1)
        {
          /* Replace with actual derivative value */
          N_VScale(ONE, f, wrk[j]);
        }
        else
        {
          /* Divided difference */
          sunrealtype delta_t = ONE / (t_ext[j - i] - t_ext[j]);
          N_VLinearSum(delta_t, wrk[j - 1], -delta_t, wrk[j], wrk[j]);
        }
      }
    }

    /* Compute derivatives of Hermite polynomial */
    N_VScale(ONE, wrk[order], zn[0]);
    for (int i = 1; i <= order; i++) { N_VConst(ZERO, zn[i]); }

    for (int i = order - 1; i >= 0; i--)
    {
      for (int j = order; j > 0; j--)
      {
        N_VLinearSum(t_ext[0] - t_ext[i], zn[j], j, zn[j - 1], zn[j]);
      }
      N_VLinearSum(t_ext[0] - t_ext[i], zn[0], ONE, wrk[i], zn[0]);
    }
  }

  /* Overwrite first two columns with input values */
  N_VScale(ONE, y[0], zn[0]);
  N_VScale(ONE, f, zn[1]);

  /* Scale entries */
  sunrealtype scale = ONE;
  for (int i = 1; i <= order; i++)
  {
    scale *= hscale / ((sunrealtype)i);
    N_VScale(scale, zn[i], zn[i]);
  }

  return CV_SUCCESS;
}